

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::JavascriptProxy::GetItemQuery
          (JavascriptProxy *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  anon_class_32_4_a283189e fn_00;
  anon_class_24_3_139dd0c7 getPropertyId_00;
  Var instance;
  bool bVar1;
  PropertyQueryFlags PVar2;
  RecyclableObject *pRVar3;
  _func_int **pp_Var4;
  PropertyDescriptor local_110;
  Type local_e0;
  Type TStack_df;
  undefined6 uStack_de;
  long local_d8;
  ScriptContext ***local_d0;
  undefined1 *local_c8;
  Var *local_c0;
  uint32 *local_b8;
  Var **local_b0;
  BOOL local_a4;
  undefined1 local_a0 [4];
  BOOL foundProperty;
  PropertyDescriptor result;
  anon_class_24_3_139dd0c7 getPropertyId;
  anon_class_32_4_a283189e fn;
  PropertyRecord *propertyRecord;
  ScriptContext *requestContext_local;
  Var *value_local;
  Var pvStack_18;
  uint32 index_local;
  Var originalInstance_local;
  JavascriptProxy *this_local;
  
  fn.originalInstance = (Var *)((long)&value_local + 4);
  fn.index = (uint32 *)&requestContext_local;
  fn.value = (Var **)&propertyRecord;
  result._40_8_ = this;
  propertyRecord = (PropertyRecord *)requestContext;
  requestContext_local = (ScriptContext *)value;
  value_local._4_4_ = index;
  pvStack_18 = originalInstance;
  originalInstance_local = this;
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_a0);
  local_c0 = fn.originalInstance;
  local_b8 = fn.index;
  local_b0 = fn.value;
  local_e0 = result.Configurable;
  TStack_df = result.fromProxy;
  uStack_de = result._42_6_;
  fn_00.index = (uint32 *)fn.originalInstance;
  fn_00.originalInstance = &stack0xffffffffffffffe8;
  fn_00.value = (Var **)fn.index;
  fn_00.requestContext = (ScriptContext **)fn.value;
  getPropertyId_00.index = (uint32 *)((long)&value_local + 4);
  getPropertyId_00.this = (JavascriptProxy *)result._40_8_;
  getPropertyId_00.propertyRecord = (PropertyRecord **)&fn.requestContext;
  local_d8 = (long)&value_local + 4;
  local_d0 = &fn.requestContext;
  local_c8 = (undefined1 *)&stack0xffffffffffffffe8;
  local_a4 = GetPropertyTrap<Js::JavascriptProxy::GetItemQuery(void*,unsigned_int,void**,Js::ScriptContext*)::__0,Js::JavascriptProxy::GetItemQuery(void*,unsigned_int,void**,Js::ScriptContext*)::__1>
                       (this,pvStack_18,(PropertyDescriptor *)local_a0,fn_00,getPropertyId_00,
                        (ScriptContext *)propertyRecord);
  if (local_a4 == 0) {
    pRVar3 = ScriptContext::GetMissingItemResult((ScriptContext *)propertyRecord);
    (requestContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo = (_func_int **)pRVar3;
  }
  else {
    bVar1 = PropertyDescriptor::IsFromProxy((PropertyDescriptor *)local_a0);
    instance = pvStack_18;
    if (bVar1) {
      PropertyDescriptor::PropertyDescriptor(&local_110,(PropertyDescriptor *)local_a0);
      pp_Var4 = (_func_int **)
                GetValueFromDescriptor(this,instance,&local_110,(ScriptContext *)propertyRecord);
      (requestContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo = pp_Var4;
    }
  }
  PVar2 = JavascriptConversion::BooleanToPropertyQueryFlags(local_a4);
  return PVar2;
}

Assistant:

PropertyQueryFlags JavascriptProxy::GetItemQuery(Var originalInstance, uint32 index, Var* value, ScriptContext * requestContext)
    {
        const PropertyRecord* propertyRecord;
        auto fn = [&](RecyclableObject* object)-> BOOL {
            return JavascriptOperators::GetItem(originalInstance, object, index, value, requestContext);
        };
        auto getPropertyId = [&]() ->PropertyId {
            PropertyIdFromInt(index, &propertyRecord);
            return propertyRecord->GetPropertyId();
        };
        PropertyDescriptor result;
        BOOL foundProperty = GetPropertyTrap(originalInstance, &result, fn, getPropertyId, requestContext);
        if (!foundProperty)
        {
            *value = requestContext->GetMissingItemResult();
        }
        else if (result.IsFromProxy())
        {
            *value = GetValueFromDescriptor(originalInstance, result, requestContext);
        }
        return JavascriptConversion::BooleanToPropertyQueryFlags(foundProperty);
    }